

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerNewScObjectLiteral(Lowerer *this,Instr *newObjInstr)

{
  LowererMD *this_00;
  Func *func;
  Var address;
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  uint32 uVar4;
  uint inlineSlotCount;
  uint slotCount;
  Opnd *pOVar5;
  IntConstOpnd *pIVar6;
  JITTimeFunctionBody *pJVar7;
  undefined8 *address_00;
  PropertyIdArray *propIds;
  intptr_t address_01;
  AddrOpnd *opndArg;
  AddrOpnd *opndArg_00;
  undefined4 *puVar8;
  long lVar9;
  LabelInstr *target;
  LabelInstr *target_00;
  MemRefOpnd *src;
  RegOpnd *baseOpnd;
  IndirOpnd *testSrc1;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  AddrOpnd *local_60;
  RegOpnd *local_40;
  
  func = this->m_func;
  pOVar5 = IR::Instr::UnlinkSrc2(newObjInstr);
  pIVar6 = IR::Opnd::AsIntConstOpnd(pOVar5);
  pJVar7 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar4 = IR::IntConstOpnd::AsUint32(pIVar6);
  address_00 = (undefined8 *)JITTimeFunctionBody::GetObjectLiteralTypeRef(pJVar7,uVar4);
  pOVar5 = IR::Instr::UnlinkSrc1(newObjInstr);
  pIVar6 = IR::Opnd::AsIntConstOpnd(pOVar5);
  pJVar7 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar4 = IR::IntConstOpnd::AsUint32(pIVar6);
  propIds = JITTimeFunctionBody::ReadPropertyIdArrayFromAuxData(pJVar7,uVar4);
  pJVar7 = Func::GetJITFunctionBody(newObjInstr->m_func);
  uVar4 = IR::IntConstOpnd::AsUint32(pIVar6);
  address_01 = JITTimeFunctionBody::GetAuxDataAddr(pJVar7,uVar4);
  inlineSlotCount = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds);
  slotCount = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds);
  opndArg = IR::AddrOpnd::New((intptr_t)address_00,AddrOpndKindDynamicMisc,this->m_func,false,
                              (Var)0x0);
  opndArg_00 = IR::AddrOpnd::New(address_01,AddrOpndKindDynamicMisc,this->m_func,false,(Var)0x0);
  if (((DAT_01441e9e == '\x01') && (address = (Var)*address_00, address != (Var)0x0)) &&
     (*(char *)((long)address + 0x31) == '\x01')) {
    local_60 = IR::AddrOpnd::New(address,AddrOpndKindDynamicType,func,false,(Var)0x0);
    pOVar5 = IR::Instr::UnlinkDst(newObjInstr);
    local_40 = IR::Opnd::AsRegOpnd(pOVar5);
    lVar9 = *(long *)((long)address + 0x28);
    if (inlineSlotCount != *(ushort *)(lVar9 + 0x12)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde3,
                         "(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity())"
                         ,
                         "inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity()"
                        );
      if (!bVar2) goto LAB_00549af3;
      *puVar8 = 0;
      lVar9 = *(long *)((long)address + 0x28);
    }
    if (slotCount != *(uint *)(lVar9 + 0xc)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xde4,
                         "(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity())",
                         "slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity()");
joined_r0x005499dd:
      if (!bVar2) goto LAB_00549af3;
      *puVar8 = 0;
    }
  }
  else {
    target = IR::LabelInstr::New(Label,func,true);
    target_00 = IR::LabelInstr::New(Label,func,false);
    local_60 = (AddrOpnd *)IR::RegOpnd::New(TyUint64,func);
    src = IR::MemRefOpnd::New((intptr_t)address_00,TyUint64,func,AddrOpndKindDynamicMisc);
    InsertMove((Opnd *)local_60,&src->super_Opnd,newObjInstr,true);
    InsertTestBranch((Opnd *)local_60,(Opnd *)local_60,BrEq_A,target,newObjInstr);
    baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)local_60);
    testSrc1 = IR::IndirOpnd::New(baseOpnd,0x31,TyInt8,func,false);
    pIVar6 = IR::IntConstOpnd::New(1,TyInt8,func,true);
    InsertTestBranch(&testSrc1->super_Opnd,&pIVar6->super_Opnd,BrEq_A,target,newObjInstr);
    local_40 = IR::Opnd::AsRegOpnd(newObjInstr->m_dst);
    if (target == (LabelInstr *)0x0) {
      if (target_00 != (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0xdfb,"(allocLabel == nullptr)","allocLabel == nullptr");
        goto joined_r0x005499dd;
      }
    }
    else {
      InsertBranch(Br,target_00,newObjInstr);
      IR::Instr::InsertBefore(newObjInstr,&target->super_Instr);
      src1Opnd = IR::HelperCallOpnd::New(HelperEnsureObjectLiteralType,func);
      this_00 = &this->m_lowererMD;
      LowererMD::LoadHelperArgument(this_00,newObjInstr,&opndArg->super_Opnd);
      LowererMD::LoadHelperArgument(this_00,newObjInstr,&opndArg_00->super_Opnd);
      LoadScriptContext(this,newObjInstr);
      instr = IR::Instr::New(Call,(Opnd *)local_60,&src1Opnd->super_Opnd,func);
      IR::Instr::InsertBefore(newObjInstr,instr);
      LowererMD::LowerCall(this_00,instr,0);
      IR::Instr::InsertBefore(newObjInstr,&target_00->super_Instr);
    }
  }
  bVar2 = Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
  if (bVar2) {
    PVar3 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    if (inlineSlotCount < PVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe03,
                         "(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity())"
                         ,
                         "inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()"
                        );
      if (!bVar2) goto LAB_00549af3;
      *puVar8 = 0;
    }
    if (inlineSlotCount != slotCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xe04,"(inlineSlotCapacity == slotCapacity)",
                         "inlineSlotCapacity == slotCapacity");
      if (!bVar2) {
LAB_00549af3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    PVar3 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    inlineSlotCount = inlineSlotCount - PVar3;
    slotCount = inlineSlotCount;
  }
  GenerateDynamicObjectAlloc
            (this,newObjInstr,inlineSlotCount,slotCount,local_40,&local_60->super_Opnd);
  IR::Instr::Remove(newObjInstr);
  return;
}

Assistant:

void
Lowerer::LowerNewScObjectLiteral(IR::Instr *newObjInstr)
{
    Func * func = m_func;
    IR::IntConstOpnd * literalObjectIdOpnd = newObjInstr->UnlinkSrc2()->AsIntConstOpnd();
    intptr_t literalTypeRef = newObjInstr->m_func->GetJITFunctionBody()->GetObjectLiteralTypeRef(literalObjectIdOpnd->AsUint32());

    IR::LabelInstr * helperLabel = nullptr;
    IR::LabelInstr * allocLabel = nullptr;
    IR::Opnd * literalTypeRefOpnd;
    IR::Opnd * literalTypeOpnd;
    IR::Opnd * propertyArrayOpnd;

    IR::IntConstOpnd * propertyArrayIdOpnd = newObjInstr->UnlinkSrc1()->AsIntConstOpnd();
    const Js::PropertyIdArray * propIds = newObjInstr->m_func->GetJITFunctionBody()->ReadPropertyIdArrayFromAuxData(propertyArrayIdOpnd->AsUint32());
    intptr_t propArrayAddr = newObjInstr->m_func->GetJITFunctionBody()->GetAuxDataAddr(propertyArrayIdOpnd->AsUint32());
    uint inlineSlotCapacity = Js::JavascriptOperators::GetLiteralInlineSlotCapacity(propIds);
    uint slotCapacity = Js::JavascriptOperators::GetLiteralSlotCapacity(propIds);
    IR::RegOpnd * dstOpnd;

    literalTypeRefOpnd = IR::AddrOpnd::New(literalTypeRef, IR::AddrOpndKindDynamicMisc, this->m_func);
    propertyArrayOpnd = IR::AddrOpnd::New(propArrayAddr, IR::AddrOpndKindDynamicMisc, this->m_func);

    //#if 0 TODO: OOP JIT, obj literal types
    // should pass in isShared bit through RPC, enable for in-proc jit to see perf impact
    Js::DynamicType * literalType = func->IsOOPJIT() || !CONFIG_FLAG(OOPJITMissingOpts) ? nullptr : *(Js::DynamicType **)literalTypeRef;

    if (literalType == nullptr || !literalType->GetIsShared())
    {
        helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        allocLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

        literalTypeOpnd = IR::RegOpnd::New(TyMachPtr, func);
        InsertMove(literalTypeOpnd, IR::MemRefOpnd::New(literalTypeRef, TyMachPtr, func), newObjInstr);
        InsertTestBranch(literalTypeOpnd, literalTypeOpnd,
            Js::OpCode::BrEq_A, helperLabel, newObjInstr);
        InsertTestBranch(IR::IndirOpnd::New(literalTypeOpnd->AsRegOpnd(), Js::DynamicType::GetOffsetOfIsShared(), TyInt8, func),
            IR::IntConstOpnd::New(1, TyInt8, func, true), Js::OpCode::BrEq_A, helperLabel, newObjInstr);

        dstOpnd = newObjInstr->GetDst()->AsRegOpnd();
    }
    else
    {
        literalTypeOpnd = IR::AddrOpnd::New(literalType, IR::AddrOpndKindDynamicType, func);
        dstOpnd = newObjInstr->UnlinkDst()->AsRegOpnd();
        Assert(inlineSlotCapacity == literalType->GetTypeHandler()->GetInlineSlotCapacity());
        Assert(slotCapacity == (uint)literalType->GetTypeHandler()->GetSlotCapacity());
    }

    if (helperLabel)
    {
        InsertBranch(Js::OpCode::Br, allocLabel, newObjInstr);

        // Slow path to ensure the type is there
        newObjInstr->InsertBefore(helperLabel);
        IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperEnsureObjectLiteralType, func);

        m_lowererMD.LoadHelperArgument(newObjInstr, literalTypeRefOpnd);
        m_lowererMD.LoadHelperArgument(newObjInstr, propertyArrayOpnd);
        LoadScriptContext(newObjInstr);

        IR::Instr * ensureTypeInstr = IR::Instr::New(Js::OpCode::Call, literalTypeOpnd, opndHelper, func);
        newObjInstr->InsertBefore(ensureTypeInstr);
        m_lowererMD.LowerCall(ensureTypeInstr, 0);

        newObjInstr->InsertBefore(allocLabel);
    }
    else
    {
        Assert(allocLabel == nullptr);
    }

    // For the next call:
    //     inlineSlotCapacity == Number of slots to allocate beyond the DynamicObject header
    //     slotCapacity - inlineSlotCapacity == Number of aux slots to allocate
    if(Js::FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds))
    {
        Assert(inlineSlotCapacity >= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity());
        Assert(inlineSlotCapacity == slotCapacity);
        slotCapacity = inlineSlotCapacity -= Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
    }
    GenerateDynamicObjectAlloc(
        newObjInstr,
        inlineSlotCapacity,
        slotCapacity,
        dstOpnd,
        literalTypeOpnd);

    newObjInstr->Remove();
}